

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_info.cc
# Opt level: O0

int __thiscall FileInfo::Update(FileInfo *this,ByteBuffer *buffer)

{
  int iVar1;
  longlong lVar2;
  _func_int **pp_Var3;
  ByteBuffer *in_RDI;
  ByteBuffer *this_00;
  
  this_00 = in_RDI;
  lVar2 = crail::ByteBuffer::GetLong(in_RDI);
  in_RDI->size_ = (int)lVar2;
  in_RDI->position_ = (int)((ulong)lVar2 >> 0x20);
  lVar2 = crail::ByteBuffer::GetLong(this_00);
  *(longlong *)&in_RDI->limit_ = lVar2;
  iVar1 = crail::ByteBuffer::GetInt(this_00);
  *(int *)&in_RDI->buf_ = iVar1;
  lVar2 = crail::ByteBuffer::GetLong(this_00);
  *(longlong *)&in_RDI->order_ = lVar2;
  pp_Var3 = (_func_int **)crail::ByteBuffer::GetLong(this_00);
  in_RDI[1]._vptr_ByteBuffer = pp_Var3;
  lVar2 = crail::ByteBuffer::GetLong(this_00);
  in_RDI[1].size_ = (int)lVar2;
  in_RDI[1].position_ = (int)((ulong)lVar2 >> 0x20);
  return 0;
}

Assistant:

int FileInfo::Update(ByteBuffer &buffer) {
  fd_ = buffer.GetLong();
  capacity_ = buffer.GetLong();
  node_type_ = buffer.GetInt();
  dir_offset_ = buffer.GetLong();
  token_ = buffer.GetLong();
  modification_time_ = buffer.GetLong();

  return 0;
}